

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O2

void __thiscall FDecalLib::ReadAllDecals(FDecalLib *this)

{
  FDecalBase *root;
  BYTE *pBVar1;
  PClassActor **ppPVar2;
  int iVar3;
  int lumpnum;
  uint uVar4;
  FDecalBase *pFVar5;
  ulong uVar6;
  ulong uVar7;
  int lastlump;
  FScanner sc;
  int local_13c;
  NameEntry *local_138;
  FScanner local_130;
  
  local_13c = 0;
  uVar4 = Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count;
  for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
    if (Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Array[uVar6] !=
        (FDecalAnimator *)0x0) {
      (*Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Array[uVar6]->
        _vptr_FDecalAnimator[1])();
      uVar4 = Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count;
    }
  }
  TArray<FDecalAnimator_*,_FDecalAnimator_*>::Clear
            (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>);
  TArray<FDecalAnimator_*,_FDecalAnimator_*>::Clear(&FDecalCombinerAnim::AnimatorList);
  TArray<unsigned_char,_unsigned_char>::Clear(&DecalTranslations);
  Clear(&DecalLibrary);
  while( true ) {
    lumpnum = FWadCollection::FindLump(&Wads,"DECALDEF",&local_13c,false);
    iVar3 = FName::NameData.NumNames;
    ppPVar2 = PClassActor::AllActorClasses.Array;
    if (lumpnum == -1) break;
    FScanner::FScanner(&local_130,lumpnum);
    ReadDecals(this,&local_130);
    FScanner::~FScanner(&local_130);
  }
  uVar7 = (ulong)PClassActor::AllActorClasses.Count;
  local_138 = FName::NameData.NameArray;
  root = this->Root;
  for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    pBVar1 = (ppPVar2[uVar6]->super_PClass).Defaults;
    uVar4 = (uint)*(undefined8 *)(pBVar1 + 0x478);
    if (uVar4 < (uint)iVar3) {
      pFVar5 = ScanTreeForName(local_138[(int)uVar4].Text,root);
      *(FDecalBase **)(pBVar1 + 0x478) = pFVar5;
    }
  }
  return;
}

Assistant:

void FDecalLib::ReadAllDecals ()
{
	int lump, lastlump = 0;
	unsigned int i;

	for(unsigned i=0;i<Animators.Size(); i++)
	{
		delete Animators[i];
	}
	Animators.Clear();
	FDecalCombinerAnim::AnimatorList.Clear();
	DecalTranslations.Clear();

	DecalLibrary.Clear();

	while ((lump = Wads.FindLump ("DECALDEF", &lastlump)) != -1)
	{
		FScanner sc(lump);
		ReadDecals (sc);
	}
	// Supporting code to allow specifying decals directly in the DECORATE lump
	for (i = 0; i < PClassActor::AllActorClasses.Size(); i++)
	{
		AActor *def = (AActor*)GetDefaultByType (PClassActor::AllActorClasses[i]);

		FName v = ENamedName(intptr_t(def->DecalGenerator));
		if (v.IsValidName())
		{
			def->DecalGenerator = ScanTreeForName (v, Root);
		}
	}
}